

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.h
# Opt level: O0

void __thiscall pm::Sampler::~Sampler(Sampler *this)

{
  code *pcVar1;
  Sampler *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Sampler() {}